

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O3

void __thiscall Arena_GetMemoryUsage_Test::TestBody(Arena_GetMemoryUsage_Test *this)

{
  size_t sVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  Arena arena;
  AssertHelper local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  AssertHelper local_58;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  MemoryBlocks local_30;
  
  memt::Arena::Arena((Arena *)&local_30);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       memt::MemoryBlocks::getMemoryUse(&local_30);
  local_70.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_50,"arena.getMemoryUse()","0",(unsigned_long *)&local_68,
             (int *)&local_70);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x1d,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0010ce20;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_48;
  }
  else {
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    if ((ulong)((long)local_30._block._end - (long)local_30._block._position) < 100) {
      memt::Arena::growCapacity((Arena *)&local_30,100);
    }
    local_30._block._position = local_30._block._position + 0x68;
    sVar1 = memt::MemoryBlocks::getMemoryUse(&local_30);
    local_68._M_head_impl._0_1_ = 99 < sVar1;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (99 < sVar1) goto LAB_0010ce20;
    testing::Message::Message((Message *)&local_70);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_60;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)&local_68,
               (AssertionResult *)"arena.getMemoryUse() >= 100","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x1f,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._1_7_,local_50[0]) != &local_40) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_50._1_7_,local_50[0]),local_40._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) + 8))();
    }
    local_48 = local_60;
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0010ce20;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_48);
LAB_0010ce20:
  memt::Arena::~Arena((Arena *)&local_30);
  return;
}

Assistant:

TEST(Arena, GetMemoryUsage) {
  memt::Arena arena;
  ASSERT_EQ(arena.getMemoryUse(), 0);
  arena.alloc(100);
  ASSERT_TRUE(arena.getMemoryUse() >= 100);
}